

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismExtend.cpp
# Opt level: O0

int pztopology::Pr<pztopology::Pr<pztopology::TPZPoint>_>::ContainedSideLocId(int side,int c)

{
  int side_00;
  int c_00;
  int iVar1;
  ostream *poVar2;
  void *this;
  int in_ESI;
  int in_EDI;
  int level;
  int confather;
  int nsideconfather;
  int fatherside;
  int ftns;
  int nsconnect;
  int in_stack_ffffffffffffffe0;
  int local_4;
  
  side_00 = NContainedSides(in_stack_ffffffffffffffe0);
  if (in_ESI < side_00) {
    c_00 = in_EDI / 3;
    if (c_00 == 0) {
      local_4 = Pr<pztopology::TPZPoint>::ContainedSideLocId(side_00,0);
    }
    else if (c_00 == 1) {
      local_4 = Pr<pztopology::TPZPoint>::ContainedSideLocId(side_00,1);
      local_4 = local_4 + 3;
    }
    else {
      iVar1 = Pr<pztopology::TPZPoint>::NContainedSides(in_stack_ffffffffffffffe0);
      local_4 = Pr<pztopology::TPZPoint>::ContainedSideLocId(side_00,c_00);
      local_4 = local_4 + (in_ESI / iVar1) * 3;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Pr<TFather>::ContainedSideLocId, side = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_EDI);
    poVar2 = std::operator<<(poVar2," connect = ");
    this = (void *)std::ostream::operator<<(poVar2,in_ESI);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int Pr<TFather>::ContainedSideLocId(int side,int c) {
		int nsconnect = NContainedSides(side);
		if(c >= nsconnect)
		{
			PZError << "Pr<TFather>::ContainedSideLocId, side = " << side << " connect = " << c << endl;
			return -1;
		}
		int ftns = side/TFather::NSides;
		int fatherside = side%TFather::NSides;
		if(ftns == 0) return TFather::ContainedSideLocId(fatherside,c);
		if(ftns == 1) return TFather::ContainedSideLocId(fatherside,c)+TFather::NSides;
		int nsideconfather = TFather::NContainedSides(fatherside);
		int confather = c%nsideconfather;
		int level = c/nsideconfather;
		return TFather::ContainedSideLocId(fatherside,confather)+level*TFather::NSides;
	}